

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O3

result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
toml::detail::parse_key_abi_cxx11_
          (result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,detail *this,location *loc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  const_iterator rollback;
  undefined1 auVar4 [8];
  pointer pbVar5;
  undefined1 auVar6 [8];
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  size_type sVar10;
  element_type *peVar11;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var12;
  value_type *pvVar13;
  value_type *pvVar14;
  error_type *__y;
  internal_error *piVar15;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> in_RCX;
  location *extraout_RDX;
  location *extraout_RDX_00;
  location *loc_00;
  location *loc_01;
  detail *ctx;
  _Alloc_hider ctx_00;
  const_iterator *pcVar16;
  long lVar17;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_01;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_02;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  keys;
  result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  k;
  value_type reg;
  result<toml::detail::region,_toml::detail::none_t> token;
  allocator_type local_3f9;
  undefined1 local_3f8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3d8;
  char local_3c8 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3b8;
  undefined1 local_398 [16];
  undefined1 local_388 [8];
  region local_380;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_338;
  location local_320;
  undefined1 local_2d8 [8];
  pointer pbStack_2d0;
  undefined1 local_2c8 [8];
  undefined1 local_2c0 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b8;
  undefined1 local_2a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298;
  const_iterator local_288 [4];
  string local_268;
  undefined1 local_248 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238 [4];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1f8;
  undefined1 local_1e0 [8];
  size_type local_1d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d0 [4];
  region local_190;
  undefined1 local_148 [24];
  region local_130;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e8;
  result<toml::detail::region,_toml::detail::none_t> local_d0;
  result<toml::detail::region,_toml::detail::none_t> local_80;
  
  rollback._M_current = *(char **)(this + 0x40);
  sequence<$2e109190$>::invoke
            ((result<toml::detail::region,_toml::detail::none_t> *)local_148,(location *)this);
  if (local_148[0] == true) {
    pvVar13 = result<toml::detail::region,_toml::detail::none_t>::unwrap
                        ((result<toml::detail::region,_toml::detail::none_t> *)local_148);
    region::region(&local_190,pvVar13);
    local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_268,*(long *)(this + 0x20),
               *(long *)(this + 0x28) + *(long *)(this + 0x20));
    make_string<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
              ((string *)local_398,(detail *)local_190.first_._M_current,
               (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)
               local_190.last_._M_current,in_RCX);
    location::location(&local_320,&local_268,(string *)local_398);
    if ((undefined1 *)local_398._0_8_ != local_388) {
      operator_delete((void *)local_398._0_8_,(long)local_388 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
    local_3b8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_3b8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_3b8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (local_320.iter_._M_current !=
        ((local_320.source_.
          super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr)->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
        _M_finish) {
      do {
        repeat<toml::detail::either<toml::detail::character<'_'>,_toml::detail::character<'\t'>_>,_toml::detail::at_least<1UL>_>
        ::invoke(&local_80,&local_320);
        loc_00 = extraout_RDX;
        if (local_80.is_ok_ == true) {
          region::~region(&local_80.field_1.succ.value);
          loc_00 = extraout_RDX_00;
        }
        parse_simple_key_abi_cxx11_
                  ((result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_398,(detail *)&local_320,loc_00);
        if (local_398[0] != true) {
          piVar15 = (internal_error *)__cxa_allocate_exception(0x78);
          local_3d8._M_allocated_capacity = (size_type)local_3c8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_3d8,"toml::parse_key: dotted key contains invalid key","");
          source_location::source_location((source_location *)local_248,&local_320);
          __y = result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::unwrap_err((result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)local_398);
          std::
          pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<toml::source_location,_true>
                    ((pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_2d8,(source_location *)local_248,__y);
          __l_01._M_len = 1;
          __l_01._M_array = (iterator)local_2d8;
          std::
          vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&local_1f8,__l_01,&local_3f9);
          local_e8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_e8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_e8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          format_underline((string *)local_3f8,(string *)&local_3d8,
                           (vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&local_1f8,&local_e8,false);
          source_location::source_location((source_location *)local_1e0,&local_320);
          internal_error::internal_error(piVar15,(string *)local_3f8,(source_location *)local_1e0);
          __cxa_throw(piVar15,&internal_error::typeinfo,internal_error::~internal_error);
        }
        pvVar14 = result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::unwrap((result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)local_398);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_3b8,&pvVar14->first);
        result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::cleanup((result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_398,(EVP_PKEY_CTX *)pvVar14);
        repeat<toml::detail::either<toml::detail::character<'_'>,_toml::detail::character<'\t'>_>,_toml::detail::at_least<1UL>_>
        ::invoke(&local_d0,&local_320);
        if (local_d0.is_ok_ == true) {
          region::~region(&local_d0.field_1.succ.value);
        }
        if (local_320.iter_._M_current ==
            ((local_320.source_.
              super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr)->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
            super__Vector_impl_data._M_finish) break;
        if (*local_320.iter_._M_current != '.') {
          piVar15 = (internal_error *)__cxa_allocate_exception(0x78);
          local_3f8._0_8_ = local_3f8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_3f8,"toml::parse_key: dotted key contains invalid key ","");
          source_location::source_location((source_location *)local_2d8,&local_320);
          std::
          pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<toml::source_location,_const_char_(&)[14],_true>
                    ((pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_398,(source_location *)local_2d8,(char (*) [14])"should be `.`");
          __l_02._M_len = 1;
          __l_02._M_array = (iterator)local_398;
          std::
          vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&local_3d8,__l_02,(allocator_type *)&local_e8);
          local_1f8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_1f8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_1f8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          format_underline((string *)local_1e0,(string *)local_3f8,
                           (vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&local_3d8,&local_1f8,false);
          source_location::source_location((source_location *)local_248,&local_320);
          internal_error::internal_error(piVar15,(string *)local_1e0,(source_location *)local_248);
          __cxa_throw(piVar15,&internal_error::typeinfo,internal_error::~internal_error);
        }
        local_320.iter_._M_current = local_320.iter_._M_current + 1;
      } while (local_320.iter_._M_current !=
               ((local_320.source_.
                 super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_finish);
    }
    std::
    pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>
    ::
    pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_true>
              ((pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>
                *)local_2d8,&local_3b8,&local_190);
    local_380.source_name_.field_2._M_allocated_capacity = local_298._M_allocated_capacity;
    uVar9 = local_2a8._8_8_;
    uVar8 = local_2b8._8_8_;
    uVar7 = local_2b8._M_allocated_capacity;
    auVar6 = local_2c8;
    pbVar5 = pbStack_2d0;
    auVar4 = local_2d8;
    local_380.source_name_._M_dataplus._M_p = (pointer)&local_380.source_name_.field_2;
    local_2d8 = (undefined1  [8])0x0;
    pbStack_2d0 = (pointer)0x0;
    local_2c8 = (undefined1  [8])0x0;
    local_380.super_region_base._vptr_region_base = (_func_int **)&PTR__region_001d4f90;
    local_2b8._M_allocated_capacity = 0;
    local_2b8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_2a8 + 0x10)) {
      local_380.source_name_.field_2._8_8_ = local_298._8_8_;
      local_2a8._0_8_ = local_380.source_name_._M_dataplus._M_p;
    }
    local_2a8._8_8_ = 0;
    local_298._M_allocated_capacity = local_298._M_allocated_capacity & 0xffffffffffffff00;
    local_380.first_._M_current = local_288[0]._M_current;
    local_380.last_._M_current = local_288[1]._M_current;
    __return_storage_ptr__->is_ok_ = true;
    (__return_storage_ptr__->field_1).succ.value.first.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)auVar4;
    (__return_storage_ptr__->field_1).succ.value.first.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pbVar5;
    (__return_storage_ptr__->field_1).succ.value.first.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)auVar6;
    local_388 = (undefined1  [8])0x0;
    local_398._0_8_ = (pointer)0x0;
    local_398._8_8_ = (pointer)0x0;
    (__return_storage_ptr__->field_1).succ.value.second.super_region_base._vptr_region_base =
         (_func_int **)&PTR__region_001d4f90;
    local_380.source_.
    super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (__return_storage_ptr__->field_1).succ.value.second.source_.
    super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)uVar7;
    (__return_storage_ptr__->field_1).succ.value.second.source_.
    super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar8;
    local_380.source_.
    super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    paVar2 = &(__return_storage_ptr__->field_1).succ.value.second.source_name_.field_2;
    (__return_storage_ptr__->field_1).succ.value.second.source_name_._M_dataplus._M_p =
         (pointer)paVar2;
    if ((pointer)local_2a8._0_8_ == local_380.source_name_._M_dataplus._M_p) {
      paVar2->_M_allocated_capacity = local_380.source_name_.field_2._M_allocated_capacity;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->field_1).succ.value.second.source_name_.field_2 + 8) =
           local_380.source_name_.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->field_1).succ.value.second.source_name_._M_dataplus._M_p =
           (pointer)local_2a8._0_8_;
      (__return_storage_ptr__->field_1).succ.value.second.source_name_.field_2._M_allocated_capacity
           = local_380.source_name_.field_2._M_allocated_capacity;
    }
    (__return_storage_ptr__->field_1).succ.value.second.source_name_._M_string_length = uVar9;
    local_380.source_name_._M_string_length = 0;
    local_380.source_name_.field_2._M_allocated_capacity =
         local_380.source_name_.field_2._M_allocated_capacity & 0xffffffffffffff00;
    (__return_storage_ptr__->field_1).succ.value.second.first_._M_current = local_288[0]._M_current;
    (__return_storage_ptr__->field_1).succ.value.second.last_._M_current = local_288[1]._M_current;
    local_2a8._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)(local_2a8 + 0x10);
    region::~region(&local_380);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_398);
    region::~region((region *)local_2c0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_2d8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_3b8);
    location::~location(&local_320);
    region::~region(&local_190);
    if (local_148[0] == true) {
      region::~region((region *)(local_148 + 8));
    }
  }
  else {
    location::reset((location *)this,rollback);
    ctx = this;
    parse_simple_key_abi_cxx11_
              ((result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_398,this,loc_01);
    if (local_398[0] == true) {
      pvVar14 = result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::unwrap((result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_398);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_248,1,&pvVar14->first,(allocator_type *)local_1e0);
      pvVar14 = result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::unwrap((result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_398);
      std::
      pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>
      ::
      pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true>
                ((pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>
                  *)local_148,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_248,&pvVar14->second);
      sVar10 = local_130.source_name_._M_string_length;
      _Var12._M_pi = local_130.source_.
                     super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
      peVar11 = local_130.source_.
                super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      uVar9 = local_148._16_8_;
      uVar8 = local_148._8_8_;
      uVar7 = local_148._0_8_;
      paVar2 = &local_130.source_name_.field_2;
      local_2a8._0_8_ = local_2a8 + 0x10;
      local_148._0_8_ = (pointer)0x0;
      local_148._8_8_ = (_func_int **)0x0;
      local_148._16_8_ = (element_type *)0x0;
      local_2c0 = (undefined1  [8])&PTR__region_001d4f90;
      local_130.source_.
      super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      local_130.source_.
      super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      ctx_00._M_p = local_130.source_name_._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130.source_name_._M_dataplus._M_p == paVar2) {
        local_298._8_8_ = local_130.source_name_.field_2._8_8_;
        ctx_00._M_p = (pointer)local_2a8._0_8_;
      }
      local_298._M_allocated_capacity._1_7_ =
           local_130.source_name_.field_2._M_allocated_capacity._1_7_;
      local_298._M_local_buf[0] = local_130.source_name_.field_2._M_local_buf[0];
      local_130.source_name_._M_string_length = 0;
      local_130.source_name_.field_2._M_local_buf[0] = '\0';
      local_288[0]._M_current = local_130.first_._M_current;
      local_288[1]._M_current = local_130.last_._M_current;
      __return_storage_ptr__->is_ok_ = true;
      (__return_storage_ptr__->field_1).succ.value.first.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)uVar7;
      (__return_storage_ptr__->field_1).succ.value.first.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)uVar8;
      (__return_storage_ptr__->field_1).succ.value.first.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)uVar9;
      local_2c8 = (undefined1  [8])0x0;
      local_2d8 = (undefined1  [8])0x0;
      pbStack_2d0 = (pointer)0x0;
      (__return_storage_ptr__->field_1).succ.value.second.super_region_base._vptr_region_base =
           (_func_int **)&PTR__region_001d4f90;
      local_2b8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (__return_storage_ptr__->field_1).succ.value.second.source_.
      super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = peVar11;
      (__return_storage_ptr__->field_1).succ.value.second.source_.
      super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = _Var12._M_pi;
      local_2b8._M_allocated_capacity = 0;
      paVar1 = &(__return_storage_ptr__->field_1).succ.value.second.source_name_.field_2;
      (__return_storage_ptr__->field_1).succ.value.second.source_name_._M_dataplus._M_p =
           (pointer)paVar1;
      if (ctx_00._M_p == (pointer)local_2a8._0_8_) {
        paVar1->_M_allocated_capacity = local_298._M_allocated_capacity;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->field_1).succ.value.second.source_name_.field_2 + 8) =
             local_298._8_8_;
      }
      else {
        (__return_storage_ptr__->field_1).succ.value.second.source_name_._M_dataplus._M_p =
             ctx_00._M_p;
        (__return_storage_ptr__->field_1).succ.value.second.source_name_.field_2.
        _M_allocated_capacity = local_298._M_allocated_capacity;
      }
      (__return_storage_ptr__->field_1).succ.value.second.source_name_._M_string_length = sVar10;
      local_2a8._8_8_ = 0;
      local_298._M_allocated_capacity =
           (ulong)(uint7)local_130.source_name_.field_2._M_allocated_capacity._1_7_ << 8;
      (__return_storage_ptr__->field_1).succ.value.second.first_._M_current =
           local_130.first_._M_current;
      (__return_storage_ptr__->field_1).succ.value.second.last_._M_current =
           local_130.last_._M_current;
      local_130.source_name_._M_dataplus._M_p = (pointer)paVar2;
      region::~region((region *)local_2c0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_2d8);
      region::~region(&local_130);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_148);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_248);
      result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::cleanup((result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_398,(EVP_PKEY_CTX *)ctx_00._M_p);
    }
    else {
      result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::cleanup((result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_398,(EVP_PKEY_CTX *)ctx);
      p_Var3 = &local_190.source_.
                super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount;
      local_190.super_region_base._vptr_region_base = (_func_int **)p_Var3;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_190,"toml::parse_key: an invalid key appeared.","");
      source_location::source_location((source_location *)local_148,(location *)this);
      std::
      pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<toml::source_location,_const_char_(&)[19],_true>
                ((pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_398,(source_location *)local_148,(char (*) [19])"is not a valid key");
      __l._M_len = 1;
      __l._M_array = (iterator)local_398;
      std::
      vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&local_320,__l,(allocator_type *)local_3d8._M_local_buf);
      local_2d8 = (undefined1  [8])local_2c8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2d8,
                 "bare keys  : non-empty strings composed only of [A-Za-z0-9_-].","");
      local_2b8._M_allocated_capacity = (size_type)(local_2c0 + 0x18);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(local_2c0 + 8),
                 "quoted keys: same as \"basic strings\" or \'literal strings\'.","");
      pcVar16 = local_288;
      local_298._M_allocated_capacity = (size_type)pcVar16;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(local_2a8 + 0x10),
                 "dotted keys: sequence of bare or quoted keys joined with a dot.","");
      __l_00._M_len = 3;
      __l_00._M_array = (iterator)local_2d8;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_3f8,__l_00,(allocator_type *)&local_3b8);
      format_underline((string *)local_1e0,(string *)&local_190,
                       (vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&local_320,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_3f8,false);
      sVar10 = local_1d8;
      local_248._0_8_ = local_238;
      if (local_1e0 == (undefined1  [8])local_1d0) {
        local_238[0]._8_8_ = local_1d0[0]._8_8_;
        local_1e0 = (undefined1  [8])local_248._0_8_;
      }
      local_238[0]._M_allocated_capacity._1_7_ = local_1d0[0]._M_allocated_capacity._1_7_;
      local_238[0]._M_local_buf[0] = local_1d0[0]._M_local_buf[0];
      local_1d8 = 0;
      local_1d0[0]._M_local_buf[0] = '\0';
      __return_storage_ptr__->is_ok_ = false;
      paVar2 = &(__return_storage_ptr__->field_1).fail.value.field_2;
      (__return_storage_ptr__->field_1).succ.value.first.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)paVar2;
      if (local_1e0 == (undefined1  [8])local_248._0_8_) {
        paVar2->_M_allocated_capacity = local_238[0]._M_allocated_capacity;
        (__return_storage_ptr__->field_1).succ.value.second.super_region_base._vptr_region_base =
             (_func_int **)local_238[0]._8_8_;
      }
      else {
        (__return_storage_ptr__->field_1).succ.value.first.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)local_1e0;
        (__return_storage_ptr__->field_1).fail.value.field_2._M_allocated_capacity =
             local_238[0]._M_allocated_capacity;
      }
      (__return_storage_ptr__->field_1).succ.value.first.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)sVar10;
      local_248._8_8_ = (pointer)0x0;
      local_238[0]._M_allocated_capacity = (ulong)(uint7)local_1d0[0]._1_7_ << 8;
      local_1e0 = (undefined1  [8])local_1d0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_3f8);
      lVar17 = -0x60;
      do {
        if (pcVar16 != (const_iterator *)pcVar16[-2]._M_current) {
          operator_delete((const_iterator *)pcVar16[-2]._M_current,(ulong)(pcVar16->_M_current + 1))
          ;
        }
        pcVar16 = pcVar16 + -4;
        lVar17 = lVar17 + 0x20;
      } while (lVar17 != 0);
      std::
      vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&local_320);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_380.first_._M_current != &local_338) {
        operator_delete(local_380.first_._M_current,(ulong)(local_338._M_allocated_capacity + 1));
      }
      source_location::~source_location((source_location *)local_398);
      source_location::~source_location((source_location *)local_148);
      if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
          local_190.super_region_base._vptr_region_base != p_Var3) {
        operator_delete(local_190.super_region_base._vptr_region_base,
                        (ulong)((long)&(local_190.source_.
                                        super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline result<std::pair<std::vector<key>, region>, std::string>
parse_key(location& loc)
{
    const auto first = loc.iter();
    // dotted key -> `foo.bar.baz` where several single keys are chained by
    // dots. Whitespaces between keys and dots are allowed.
    if(const auto token = lex_dotted_key::invoke(loc))
    {
        const auto reg = token.unwrap();
        location inner_loc(loc.name(), reg.str());
        std::vector<key> keys;

        while(inner_loc.iter() != inner_loc.end())
        {
            lex_ws::invoke(inner_loc);
            if(const auto k = parse_simple_key(inner_loc))
            {
                keys.push_back(k.unwrap().first);
            }
            else
            {
                throw internal_error(format_underline(
                    "toml::parse_key: dotted key contains invalid key",
                    {{source_location(inner_loc), k.unwrap_err()}}),
                    source_location(inner_loc));
            }

            lex_ws::invoke(inner_loc);
            if(inner_loc.iter() == inner_loc.end())
            {
                break;
            }
            else if(*inner_loc.iter() == '.')
            {
                inner_loc.advance(); // to skip `.`
            }
            else
            {
                throw internal_error(format_underline("toml::parse_key: "
                    "dotted key contains invalid key ",
                    {{source_location(inner_loc), "should be `.`"}}),
                    source_location(inner_loc));
            }
        }
        return ok(std::make_pair(keys, reg));
    }
    loc.reset(first);

    // simple_key: a single (basic_string|literal_string|bare key)
    if(const auto smpl = parse_simple_key(loc))
    {
        return ok(std::make_pair(std::vector<key>(1, smpl.unwrap().first),
                                 smpl.unwrap().second));
    }
    return err(format_underline("toml::parse_key: an invalid key appeared.",
                {{source_location(loc), "is not a valid key"}}, {
                "bare keys  : non-empty strings composed only of [A-Za-z0-9_-].",
                "quoted keys: same as \"basic strings\" or 'literal strings'.",
                "dotted keys: sequence of bare or quoted keys joined with a dot."
                }));
}